

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

bool __thiscall
ThreadedReplayer::enqueue_create_shader_module
          (ThreadedReplayer *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          VkShaderModule *module)

{
  atomic<unsigned_int> *paVar1;
  pointer pPVar2;
  SharedControlBlock *pSVar3;
  VkValidationCacheEXT pVVar4;
  DatabaseInterface *pDVar5;
  undefined8 uVar6;
  int iVar7;
  VkResult VVar8;
  size_type sVar9;
  spv_validator_options options;
  long lVar10;
  long lVar11;
  mapped_type *pmVar12;
  _Alloc_hider _Var13;
  spv_target_env env;
  bool bVar14;
  uint uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  bool bVar17;
  SpirvTools context;
  VkShaderModuleValidationCacheCreateInfoEXT validation_info;
  undefined1 local_d8 [16];
  _Alloc_hider local_c8;
  _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  size_type sStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  code *local_40;
  
  *module = (VkShaderModule)0x0;
  uVar15 = *(uint *)(in_FS_OFFSET + -0x18);
  pPVar2 = (this->per_thread_data).
           super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar16 = pPVar2[uVar15].expected_hash == hash;
  bVar17 = pPVar2[uVar15].expected_tag == RESOURCE_SHADER_MODULE;
  bVar14 = bVar17 && bVar16;
  local_d8._0_8_ = hash;
  if (bVar17 && bVar16) {
    _Var13._M_p = (pointer)(pPVar2 + uVar15);
    ((pointer)_Var13._M_p)->acknowledge_parsing_work = true;
    sVar9 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->masked_shader_modules)._M_h,(key_type *)local_d8);
    if ((sVar9 != 0) ||
       (bVar16 = resource_is_blacklisted(this,RESOURCE_SHADER_MODULE,local_d8._0_8_), bVar16)) {
      iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->internal_enqueue_mutex);
      if (iVar7 != 0) {
LAB_0013f2fc:
        std::__throw_system_error(iVar7);
      }
      Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                (&this->shader_modules,local_d8._0_8_,*module,1);
      pSVar3 = (this->opts).control_block;
      if (pSVar3 != (SharedControlBlock *)0x0) {
        LOCK();
        paVar1 = &pSVar3->banned_modules;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->internal_enqueue_mutex);
    }
    else {
      local_c8._M_p = _Var13._M_p;
      if (((this->opts).spirv_validate == true) &&
         (bVar16 = has_resource_in_whitelist(this,RESOURCE_SHADER_MODULE,local_d8._0_8_), !bVar16))
      {
        local_d8._8_8_ = std::chrono::_V2::steady_clock::now();
        env = SPV_ENV_VULKAN_1_3;
        if (((this->device)._M_t.
             super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
             .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->api_version ==
            0) {
          env = SPV_ENV_VULKAN_1_0;
        }
        spvtools::SpirvTools::SpirvTools((SpirvTools *)&local_b8._M_allocated_capacity,env);
        options = spvValidatorOptionsCreate();
        bVar16 = Fossilize::FeatureFilter::supports_scalar_block_layout
                           (&((this->device)._M_t.
                              super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                              .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)
                             ->feature_filter);
        spvValidatorOptionsSetScalarBlockLayout(options,bVar16);
        local_58._M_allocated_capacity = 0;
        local_58._8_8_ = 0;
        local_40 = std::
                   _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:1992:31)>
                   ::_M_invoke;
        local_48._M_p =
             (pointer)std::
                      _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp:1992:31)>
                      ::_M_manager;
        spvtools::SpirvTools::SetMessageConsumer
                  ((SpirvTools *)&local_b8._M_allocated_capacity,(MessageConsumer *)&local_58);
        if ((code *)local_48._M_p != (code *)0x0) {
          (*(code *)local_48._M_p)(&local_58,&local_58,3);
        }
        bVar16 = spvtools::SpirvTools::Validate
                           ((SpirvTools *)&local_b8._M_allocated_capacity,create_info->pCode,
                            create_info->codeSize >> 2,options);
        lVar10 = std::chrono::_V2::steady_clock::now();
        LOCK();
        (this->shader_module_ns).super___atomic_base<unsigned_long>._M_i =
             (this->shader_module_ns).super___atomic_base<unsigned_long>._M_i +
             (lVar10 - local_d8._8_8_);
        UNLOCK();
        if (bVar16) {
          spvValidatorOptionsDestroy(options);
          spvtools::SpirvTools::~SpirvTools((SpirvTools *)&local_b8._M_allocated_capacity);
          _Var13._M_p = local_c8._M_p;
        }
        else {
          fprintf(_stderr,"Fossilize WARN: Failed to validate SPIR-V module: %0lX, skipping!\n",
                  local_d8._0_8_);
          fflush(_stderr);
          *module = (VkShaderModule)0x0;
          iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->internal_enqueue_mutex);
          if (iVar7 != 0) goto LAB_0013f2fc;
          Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                    (&this->shader_modules,local_d8._0_8_,(VkShaderModule_T *)0x0,1);
          LOCK();
          (this->shader_module_count).super___atomic_base<unsigned_int>._M_i =
               (this->shader_module_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
          pSVar3 = (this->opts).control_block;
          if (pSVar3 != (SharedControlBlock *)0x0) {
            LOCK();
            paVar1 = &pSVar3->module_validation_failures;
            (paVar1->super___atomic_base<unsigned_int>)._M_i =
                 (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
            UNLOCK();
          }
          blacklist_resource(this,RESOURCE_SHADER_MODULE,local_d8._0_8_);
          pthread_mutex_unlock((pthread_mutex_t *)&this->internal_enqueue_mutex);
          spvValidatorOptionsDestroy(options);
          spvtools::SpirvTools::~SpirvTools((SpirvTools *)&local_b8._M_allocated_capacity);
          _Var13._M_p = local_c8._M_p;
          if (!bVar16) {
            return bVar14;
          }
        }
      }
      bVar16 = Fossilize::FeatureFilter::shader_module_is_supported
                         (&((this->device)._M_t.
                            super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                            .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                           feature_filter,create_info);
      if (bVar16) {
        ((pointer)_Var13._M_p)->triggered_validation_error = false;
        if (this->loop_count != 0) {
          local_c0 = (_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->shader_module_to_hash;
          local_d8._8_8_ = &this->module_identifier_db_mutex;
          uVar15 = 0;
          do {
            if (*module != (VkShaderModule)0x0) {
              (*vkDestroyShaderModule)
                        (((this->device)._M_t.
                          super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                          .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                         device,*module,(VkAllocationCallbacks *)0x0);
            }
            *module = (VkShaderModule)0x0;
            local_68._M_p = (pointer)0x0;
            local_78._M_allocated_capacity = 0x3b9d3b01;
            local_78._8_8_ = 0;
            pVVar4 = this->validation_cache;
            if (pVVar4 != (VkValidationCacheEXT)0x0) {
              create_info->pNext = &local_78;
              local_68._M_p = (pointer)pVVar4;
            }
            lVar10 = std::chrono::_V2::steady_clock::now();
            VVar8 = (*vkCreateShaderModule)
                              (((this->device)._M_t.
                                super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                                .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>.
                               _M_head_impl)->device,create_info,(VkAllocationCallbacks *)0x0,module
                              );
            if (VVar8 == VK_SUCCESS) {
              lVar11 = std::chrono::_V2::steady_clock::now();
              LOCK();
              (this->shader_module_ns).super___atomic_base<unsigned_long>._M_i =
                   (this->shader_module_ns).super___atomic_base<unsigned_long>._M_i +
                   (lVar11 - lVar10);
              UNLOCK();
              LOCK();
              (this->shader_module_count).super___atomic_base<unsigned_int>._M_i =
                   (this->shader_module_count).super___atomic_base<unsigned_int>._M_i + 1;
              UNLOCK();
              if (this->robustness == true) {
                iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->internal_enqueue_mutex);
                uVar6 = local_d8._0_8_;
                if (iVar7 != 0) goto LAB_0013f2fc;
                pmVar12 = std::__detail::
                          _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](local_c0,module);
                *pmVar12 = uVar6;
                pthread_mutex_unlock((pthread_mutex_t *)&this->internal_enqueue_mutex);
              }
              if ((uVar15 == 0) &&
                 ((this->module_identifier_db)._M_t.
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl !=
                  (DatabaseInterface *)0x0)) {
                local_b8._8_8_ = 0;
                local_98._M_allocated_capacity = 0;
                local_98._8_8_ = 0;
                local_a8._M_p = (pointer)0x0;
                sStack_a0 = 0;
                local_88._M_p = (pointer)0x0;
                local_b8._M_allocated_capacity = 0x3ba1d6b3;
                (*vkGetShaderModuleIdentifierEXT)
                          (((this->device)._M_t.
                            super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                            .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                           device,*module,(VkShaderModuleIdentifierEXT *)&local_b8);
                iVar7 = pthread_mutex_lock((pthread_mutex_t *)local_d8._8_8_);
                if (iVar7 != 0) goto LAB_0013f2fc;
                pDVar5 = (this->module_identifier_db)._M_t.
                         super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                         .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
                iVar7 = (*pDVar5->_vptr_DatabaseInterface[5])(pDVar5,4,local_d8._0_8_);
                if ((char)iVar7 == '\0') {
                  pDVar5 = (this->module_identifier_db)._M_t.
                           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>.
                           _M_head_impl;
                  (*pDVar5->_vptr_DatabaseInterface[4])
                            (pDVar5,4,local_d8._0_8_,(undefined1 *)((long)&local_a8._M_p + 4),
                             (ulong)local_a8._M_p & 0xffffffff,8);
                }
                pthread_mutex_unlock((pthread_mutex_t *)local_d8._8_8_);
              }
              pSVar3 = (this->opts).control_block;
              if (pSVar3 != (SharedControlBlock *)0x0 && uVar15 == 0) {
                LOCK();
                paVar1 = &pSVar3->successful_modules;
                (paVar1->super___atomic_base<unsigned_int>)._M_i =
                     (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
                UNLOCK();
              }
              if (uVar15 == 0) {
                Fossilize::FeatureFilter::register_shader_module_info
                          (&((this->device)._M_t.
                             super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                             .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)
                            ->feature_filter,*module,create_info);
              }
            }
            else {
              enqueue_create_shader_module((ThreadedReplayer *)local_d8);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < this->loop_count);
        }
        iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->internal_enqueue_mutex);
        if (iVar7 != 0) goto LAB_0013f2fc;
        Fossilize::ObjectCache<VkShaderModule_T_*>::insert_object
                  (&this->shader_modules,local_d8._0_8_,*module,create_info->codeSize);
        pthread_mutex_unlock((pthread_mutex_t *)&this->internal_enqueue_mutex);
        if ((bool)local_c8._M_p[0xbd] == false) {
          whitelist_resource(this,RESOURCE_SHADER_MODULE,local_d8._0_8_);
        }
        else {
          blacklist_resource(this,RESOURCE_SHADER_MODULE,local_d8._0_8_);
        }
      }
      else {
        enqueue_create_shader_module();
      }
    }
  }
  else {
    enqueue_create_shader_module();
  }
  return bVar14;
}

Assistant:

bool enqueue_create_shader_module(Hash hash, const VkShaderModuleCreateInfo *create_info, VkShaderModule *module) override
	{
		*module = VK_NULL_HANDLE;

		auto &per_thread = get_per_thread_data();
		if (per_thread.expected_hash != hash || per_thread.expected_tag != RESOURCE_SHADER_MODULE)
		{
			LOGE("Unexpected resource type or hash in blob, ignoring.\n");
			return false;
		}

		per_thread.acknowledge_parsing_work = true;

		if (masked_shader_modules.count(hash) || resource_is_blacklisted(RESOURCE_SHADER_MODULE, hash))
		{
			lock_guard<mutex> lock(internal_enqueue_mutex);
			//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
			shader_modules.insert_object(hash, *module, 1);
			if (opts.control_block)
				opts.control_block->banned_modules.fetch_add(1, std::memory_order_relaxed);
			return true;
		}

#ifdef FOSSILIZE_REPLAYER_SPIRV_VAL
		if (opts.spirv_validate && !has_resource_in_whitelist(RESOURCE_SHADER_MODULE, hash))
		{
			auto start_time = chrono::steady_clock::now();
			spv_target_env env;
			if (device->get_api_version() >= VK_VERSION_1_3)
				env = SPV_ENV_VULKAN_1_3;
			else if (device->get_api_version() >= VK_VERSION_1_2)
				env = SPV_ENV_VULKAN_1_2;
			else if (device->get_api_version() >= VK_VERSION_1_1)
				env = SPV_ENV_VULKAN_1_1;
			else
				env = SPV_ENV_VULKAN_1_0;

			spvtools::SpirvTools context(env);
			spvtools::ValidatorOptions validation_opts;
			validation_opts.SetScalarBlockLayout(device->get_feature_filter().supports_scalar_block_layout());
			context.SetMessageConsumer([](spv_message_level_t, const char *, const spv_position_t &, const char *message) {
				LOGE("spirv-val: %s\n", message);
			});

			bool ret = context.Validate(create_info->pCode, create_info->codeSize / 4, validation_opts);

			auto end_time = chrono::steady_clock::now();
			auto duration_ns = chrono::duration_cast<chrono::nanoseconds>(end_time - start_time).count();
			shader_module_ns.fetch_add(duration_ns, std::memory_order_relaxed);

			if (!ret)
			{
				LOGW("Failed to validate SPIR-V module: %0" PRIX64 ", skipping!\n", hash);
				*module = VK_NULL_HANDLE;
				lock_guard<mutex> lock(internal_enqueue_mutex);
				//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
				shader_modules.insert_object(hash, VK_NULL_HANDLE, 1);
				shader_module_count.fetch_add(1, std::memory_order_relaxed);

				if (opts.control_block)
					opts.control_block->module_validation_failures.fetch_add(1, std::memory_order_relaxed);

				blacklist_resource(RESOURCE_SHADER_MODULE, hash);
				return true;
			}
		}
#endif

		if (!device->get_feature_filter().shader_module_is_supported(create_info))
		{
			LOGW("Shader module %0" PRIx64 " is not supported on this device.\n", hash);
			*module = VK_NULL_HANDLE;

			lock_guard<mutex> lock(internal_enqueue_mutex);
			//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
			shader_modules.insert_object(hash, VK_NULL_HANDLE, 1);
			shader_module_count.fetch_add(1, std::memory_order_relaxed);

			if (opts.control_block)
				opts.control_block->module_validation_failures.fetch_add(1, std::memory_order_relaxed);

			return true;
		}

		per_thread.triggered_validation_error = false;

		for (unsigned i = 0; i < loop_count; i++)
		{
			// Avoid leak.
			if (*module != VK_NULL_HANDLE)
				vkDestroyShaderModule(device->get_device(), *module, nullptr);
			*module = VK_NULL_HANDLE;

			VkShaderModuleValidationCacheCreateInfoEXT validation_info = { VK_STRUCTURE_TYPE_SHADER_MODULE_VALIDATION_CACHE_CREATE_INFO_EXT };
			if (validation_cache)
			{
				validation_info.validationCache = validation_cache;
				const_cast<VkShaderModuleCreateInfo *>(create_info)->pNext = &validation_info;
			}

			auto start_time = chrono::steady_clock::now();
			if (vkCreateShaderModule(device->get_device(), create_info, nullptr, module) == VK_SUCCESS)
			{
				auto end_time = chrono::steady_clock::now();
				auto duration_ns = chrono::duration_cast<chrono::nanoseconds>(end_time - start_time).count();
				shader_module_ns.fetch_add(duration_ns, std::memory_order_relaxed);
				shader_module_count.fetch_add(1, std::memory_order_relaxed);

				if (robustness)
				{
					lock_guard<mutex> lock(internal_enqueue_mutex);
					shader_module_to_hash[*module] = hash;
				}

				if (i == 0 && module_identifier_db)
				{
					VkShaderModuleIdentifierEXT ident = { VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT };
					vkGetShaderModuleIdentifierEXT(device->get_device(), *module, &ident);
					std::lock_guard<std::mutex> holder{module_identifier_db_mutex};
					if (!module_identifier_db->has_entry(RESOURCE_SHADER_MODULE, hash))
					{
						module_identifier_db->write_entry(RESOURCE_SHADER_MODULE, hash,
						                                  ident.identifier, ident.identifierSize,
						                                  PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT);
					}
				}

				if (opts.control_block && i == 0)
					opts.control_block->successful_modules.fetch_add(1, std::memory_order_relaxed);

				if (i == 0)
					device->get_feature_filter().register_shader_module_info(*module, create_info);
			}
			else
			{
				LOGE("Failed to create shader module for hash 0x%016" PRIx64 ".\n", hash);
			}
		}

		{
			lock_guard<mutex> lock(internal_enqueue_mutex);
			//LOGI("Inserting shader module %016llx.\n", static_cast<unsigned long long>(hash));
			shader_modules.insert_object(hash, *module, create_info->codeSize);
		}

		// vkCreateShaderModule doesn't generally crash anything, so just deal with blacklisting here
		// rather than in an error callback.
		if (!per_thread.triggered_validation_error)
			whitelist_resource(RESOURCE_SHADER_MODULE, hash);
		else
			blacklist_resource(RESOURCE_SHADER_MODULE, hash);

		return true;
	}